

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86.cpp
# Opt level: O0

int __thiscall
ncnn::HardSwish_x86::forward_inplace(HardSwish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  long lVar4;
  int iVar5;
  long *in_RSI;
  long in_RDI;
  undefined1 auVar6 [16];
  __m128 _ans;
  __m128 _p;
  __m128 _one;
  __m128 _zero;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  int local_288;
  float *local_230;
  int local_224;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  
  lVar4 = in_RSI[7];
  iVar5 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34) *
          (int)in_RSI[3];
  for (local_224 = 0; local_224 < (int)lVar4; local_224 = local_224 + 1) {
    local_230 = (float *)(*in_RSI + in_RSI[8] * (long)local_224 * in_RSI[2]);
    for (local_288 = 0; local_288 + 3 < iVar5; local_288 = local_288 + 4) {
      fVar1 = *(float *)(in_RDI + 0xd4);
      fVar2 = *(float *)(in_RDI + 0xd0);
      local_f8 = (float)*(undefined8 *)local_230;
      fStack_f4 = (float)((ulong)*(undefined8 *)local_230 >> 0x20);
      fStack_f0 = (float)*(undefined8 *)(local_230 + 2);
      fStack_ec = (float)((ulong)*(undefined8 *)(local_230 + 2) >> 0x20);
      local_2c8 = CONCAT44(fStack_f4 * fVar2 + fVar1,local_f8 * fVar2 + fVar1);
      uStack_2c0._0_4_ = fStack_f0 * fVar2 + fVar1;
      uStack_2c0._4_4_ = fStack_ec * fVar2 + fVar1;
      auVar6._8_8_ = uStack_2c0;
      auVar6._0_8_ = local_2c8;
      auVar6 = maxps(auVar6,ZEXT816(0));
      auVar3._8_8_ = 0x3f8000003f800000;
      auVar3._0_8_ = 0x3f8000003f800000;
      auVar6 = minps(auVar6,auVar3);
      local_118 = auVar6._0_4_;
      fStack_114 = auVar6._4_4_;
      fStack_110 = auVar6._8_4_;
      fStack_10c = auVar6._12_4_;
      local_2c8 = CONCAT44(fStack_114 * fStack_f4,local_118 * local_f8);
      uStack_2c0._0_4_ = fStack_110 * fStack_f0;
      uStack_2c0._4_4_ = fStack_10c * fStack_ec;
      *(undefined8 *)local_230 = local_2c8;
      *(undefined8 *)(local_230 + 2) = uStack_2c0;
      local_230 = local_230 + 4;
    }
    for (; local_288 < iVar5; local_288 = local_288 + 1) {
      if (*(float *)(in_RDI + 0xd8) <= *local_230) {
        if (*local_230 < *(float *)(in_RDI + 0xdc) || *local_230 == *(float *)(in_RDI + 0xdc)) {
          *local_230 = *local_230 *
                       (*local_230 * *(float *)(in_RDI + 0xd0) + *(float *)(in_RDI + 0xd4));
        }
      }
      else {
        *local_230 = 0.0;
      }
      local_230 = local_230 + 1;
    }
  }
  return 0;
}

Assistant:

int HardSwish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _ans = _mm512_mul_ps(_ans, _p);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _ans = _mm_mul_ps(_ans, _p);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ptr++;
        }
    }

    return 0;
}